

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_session_disconnect_ex(LIBSSH2_SESSION *session,int reason,char *desc,char *lang)

{
  int iVar1;
  int iVar2;
  time_t start_time;
  size_t len;
  size_t data2_len;
  char *errmsg;
  uchar *local_48;
  uint32_t local_3c;
  uchar *local_38;
  
  *(byte *)&session->state = (byte)session->state & 0xfe;
  local_3c = reason;
  start_time = time((time_t *)0x0);
  local_38 = session->disconnect_data + 1;
  do {
    if (session->disconnect_state == libssh2_NB_state_idle) {
      if (desc == (char *)0x0) {
        len = 0;
      }
      else {
        len = strlen(desc);
      }
      if (lang == (char *)0x0) {
        data2_len = 0;
      }
      else {
        data2_len = strlen(lang);
      }
      if (len < 0x101) {
        if (data2_len < 0x101) {
          session->disconnect_data_len = len + data2_len + 0xd;
          local_48 = local_38;
          session->disconnect_data[0] = '\x01';
          _libssh2_store_u32(&local_48,local_3c);
          _libssh2_store_str(&local_48,desc,len);
          _libssh2_store_u32(&local_48,(uint32_t)data2_len);
          session->disconnect_state = libssh2_NB_state_created;
          goto LAB_0010a5c2;
        }
        errmsg = "too long language string";
      }
      else {
        errmsg = "too long description";
      }
      iVar2 = _libssh2_error(session,-0x22,errmsg);
    }
    else {
      data2_len = 0;
LAB_0010a5c2:
      iVar1 = _libssh2_transport_send
                        (session,session->disconnect_data,session->disconnect_data_len,(uchar *)lang
                         ,data2_len);
      iVar2 = -0x25;
      if (iVar1 != -0x25) {
        session->disconnect_state = libssh2_NB_state_idle;
        iVar2 = 0;
      }
    }
    if (iVar2 != -0x25) {
      return iVar2;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(session,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_session_disconnect_ex(LIBSSH2_SESSION *session, int reason,
                              const char *desc, const char *lang)
{
    int rc;
    session->state &= ~LIBSSH2_STATE_EXCHANGING_KEYS;
    BLOCK_ADJUST(rc, session,
                 session_disconnect(session, reason, desc, lang));

    return rc;
}